

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O2

int QTlsPrivate::X509CertificateOpenSSL::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_60;
  QArrayDataPointer<QSslCertificate> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (QSslCertificate *)0xaaaaaaaaaaaaaaaa;
  QSslConfiguration::defaultConfiguration();
  QSslConfiguration::caCertificates();
  QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_60);
  cVar1 = QSslSocketPrivate::rootCertOnDemandLoadingSupported();
  if (cVar1 != '\0') {
    QSslSocketPrivate::systemCaCertificates();
    QList<QSslCertificate>::append
              ((QList<QSslCertificate> *)&local_48,(QList<QSslCertificate> *)&local_60);
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_60);
  }
  verify(ctx,(uchar *)&local_48,(size_t)sig,(uchar *)siglen,tbslen);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)ctx;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslError> X509CertificateOpenSSL::verify(const QList<QSslCertificate> &chain,
                                                const QString &hostName)
{
    // This was previously QSslSocketPrivate::verify().
    auto roots = QSslConfiguration::defaultConfiguration().caCertificates();
#ifndef Q_OS_WIN
    // On Windows, system CA certificates are already set as default ones.
    // No need to add them again (and again) and also, if the default configuration
    // has its own set of CAs, this probably should not be amended by the ones
    // from the 'ROOT' store, since it's not what an application chose to trust.
    if (QSslSocketPrivate::rootCertOnDemandLoadingSupported())
        roots.append(QSslSocketPrivate::systemCaCertificates());
#endif // Q_OS_WIN
    return verify(roots, chain, hostName);
}